

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSupMin.c
# Opt level: O0

void Gia_ManSupExperiment(Gia_Man_t *pGia,Vec_Int_t *vPairs)

{
  int iVar1;
  Gia_ManSup_t *p_00;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint local_34;
  int i;
  Gia_Obj_t *pCare;
  Gia_Obj_t *pData;
  Gia_ManSup_t *p;
  Vec_Int_t *vPairs_local;
  Gia_Man_t *pGia_local;
  
  p_00 = Gia_ManSupStart(0x10);
  p_00->pGia = pGia;
  iVar1 = Vec_IntSize(vPairs);
  if (iVar1 % 2 == 0) {
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vPairs);
      if (iVar1 / 2 <= (int)local_34) break;
      Abc_Print(1,"%6d : ",(ulong)local_34);
      iVar1 = Vec_IntEntry(vPairs,local_34 << 1);
      pGVar2 = Gia_ManPo(pGia,iVar1);
      iVar1 = Vec_IntEntry(vPairs,local_34 * 2 + 1);
      pGVar3 = Gia_ManPo(pGia,iVar1);
      pGVar2 = Gia_ObjChild0(pGVar2);
      pGVar3 = Gia_ObjChild0(pGVar3);
      Gia_ManSupExperimentOne(p_00,pGVar2,pGVar3);
      local_34 = local_34 + 1;
    }
    Gia_ManSupStop(p_00);
    return;
  }
  __assert_fail("Vec_IntSize(vPairs) % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSupMin.c"
                ,0x94,"void Gia_ManSupExperiment(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManSupExperiment( Gia_Man_t * pGia, Vec_Int_t * vPairs )
{
    Gia_ManSup_t * p;
    Gia_Obj_t * pData, * pCare;
    int i;
    p = Gia_ManSupStart( 16 );
    p->pGia = pGia;
    assert( Vec_IntSize(vPairs) % 2 == 0 );
    for ( i = 0; i < Vec_IntSize(vPairs)/2; i++ )
    {
        Abc_Print( 1, "%6d : ", i );
        pData = Gia_ManPo( pGia, Vec_IntEntry(vPairs, 2*i+0) );
        pCare = Gia_ManPo( pGia, Vec_IntEntry(vPairs, 2*i+1) );
        Gia_ManSupExperimentOne( p, Gia_ObjChild0(pData), Gia_ObjChild0(pCare) );
    }
    Gia_ManSupStop( p );
}